

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

void __thiscall CRegexParser::reset(CRegexParser *this)

{
  re_recog_type rVar1;
  int iVar2;
  wchar_t *pwVar3;
  anon_union_16_5_eb0a944d_for_info *paVar4;
  re_tuple_conflict *prVar5;
  anon_union_16_5_eb0a944d_for_info *paVar6;
  
  if (0 < this->next_state_) {
    prVar5 = this->tuple_arr_;
    paVar6 = &prVar5->info;
    iVar2 = 0;
    do {
      rVar1 = ((re_tuple_conflict *)((long)paVar6 + -8))->typ;
      if ((rVar1 - RE_RANGE < 2) &&
         (pwVar3 = (paVar6->str).str, paVar4 = paVar6, pwVar3 != (wchar_t *)0x0)) {
LAB_002b425e:
        operator_delete__(pwVar3);
        (paVar4->str).str = (wchar_t *)0x0;
      }
      else if ((rVar1 == RE_LITSTR) && (pwVar3 = (paVar6->str).str, pwVar3 != (wchar_t *)0x0)) {
        paVar4 = &prVar5->info;
        goto LAB_002b425e;
      }
      ((re_tuple_conflict *)((long)paVar6 + -8))->typ = RE_INVALID;
      iVar2 = iVar2 + 1;
      prVar5 = prVar5 + 1;
      paVar6 = (anon_union_16_5_eb0a944d_for_info *)((long)paVar6 + 0x28);
    } while (iVar2 < this->next_state_);
  }
  this->next_state_ = 0;
  return;
}

Assistant:

void CRegexParser::reset()
{
    /* delete any range tables we've allocated */
    int i;
    re_tuple *t;
    for (i = 0, t = tuple_arr_ ; i < next_state_ ; ++i, ++t)
    {
        /* if it's a range, delete the allocated range */
        if ((t->typ == RE_RANGE || t->typ == RE_RANGE_EXCL)
            && t->info.range.char_range != 0)
        {
            delete [] t->info.range.char_range;
            t->info.range.char_range = 0;
        }
        else if (t->typ == RE_LITSTR && t->info.str.str != 0)
        {
            delete [] t->info.str.str;
            t->info.str.str = 0;
        }

        /* clear the tuple type */
        t->typ = RE_INVALID;
    }

    /* clear states */
    next_state_ = RE_STATE_FIRST_VALID;
}